

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall JetHead::Socket::getLocalAddress(Socket *this,Address *addr)

{
  socklen_t sVar1;
  int iVar2;
  socklen_t sock_len;
  sockaddr_in sock_addr;
  socklen_t local_58;
  sockaddr local_54;
  sa_family_t local_44;
  in_port_t local_42;
  in_addr_t local_40;
  
  local_58 = 0x10;
  iVar2 = getsockname(this->mFd,&local_54,&local_58);
  sVar1 = local_58;
  if (iVar2 == 0) {
    memcpy(&local_44,&local_54,(long)(int)local_58);
    (addr->mAddr).sin_family = local_44;
    (addr->mAddr).sin_addr.s_addr = local_40;
    (addr->mAddr).sin_port = local_42;
    addr->mLen = sVar1;
  }
  else {
    (addr->mAddr).sin_family = 2;
    (addr->mAddr).sin_port = 0;
    (addr->mAddr).sin_addr = 0;
    addr->mLen = 0x10;
  }
  return iVar2;
}

Assistant:

int Socket::getLocalAddress( Socket::Address &addr )
{
	struct sockaddr_in sock_addr;
	socklen_t sock_len = sizeof( sock_addr );
	
	int res = getsockname( mFd, (struct sockaddr*)&sock_addr, &sock_len );
	
	if ( res == 0 )
	{
		addr = Socket::Address( &sock_addr, sock_len );
	}
	else
	{
		addr = Socket::Address();
	}
	
	return res;
}